

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O3

void __thiscall
DescriptorKeyInfo_Constructor_Pubkey_Test::~DescriptorKeyInfo_Constructor_Pubkey_Test
          (DescriptorKeyInfo_Constructor_Pubkey_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(DescriptorKeyInfo, Constructor_Pubkey) {
  Pubkey pubkey("03d3f817091de0bbe51e19b53303b12e463f664894d49cb5bf5bb19c88fbc54d8d");
  std::string parent_info = "[ef57314e/0'/0'/4']";
  DescriptorKeyInfo key_info;
  std::string key_str;

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(pubkey));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), pubkey.GetHex().c_str());
  EXPECT_EQ(key_info.GetKeyType(),  DescriptorKeyType::kDescriptorKeyPublic);

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(pubkey, parent_info));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), (parent_info + pubkey.GetHex()).c_str());
  EXPECT_FALSE(key_info.HasPrivkey());
  EXPECT_FALSE(key_info.HasExtPubkey());
  EXPECT_FALSE(key_info.HasExtPrivkey());
  EXPECT_STREQ(key_info.GetPubkey().GetHex().c_str(),  pubkey.GetHex().c_str());
}